

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void __thiscall absl::lts_20250127::crc_internal::CRC32::InitTables(CRC32 *this)

{
  int iVar1;
  uint32_t poly;
  Uint32By256 *t_00;
  char *absl_raw_log_internal_basename_1;
  uint32_t kCrc32cUnextendPoly;
  int i_3;
  char *absl_raw_log_internal_basename;
  int j;
  int i_2;
  size_t b;
  size_t i_1;
  size_t size;
  uint32_t last;
  int i;
  Uint32By256 *t;
  CRC32 *this_local;
  
  t_00 = (Uint32By256 *)operator_new__(0x1000);
  CRCImpl::FillWordTable(0x82f63b78,0x82f63b78,1,t_00);
  for (size._4_4_ = 0; size._4_4_ != 0x100; size._4_4_ = size._4_4_ + 1) {
    this->table0_[size._4_4_] = (*t_00)[size._4_4_];
  }
  size._0_4_ = 0x82f63b78;
  for (b = 0; b < 0xc; b = b + 1) {
    size._0_4_ = (uint)size >> 8 ^ this->table0_[(uint)size & 0xff];
  }
  CRCImpl::FillWordTable(0x82f63b78,(uint)size,4,t_00);
  for (_j = 0; _j < 4; _j = _j + 1) {
    for (absl_raw_log_internal_basename._4_4_ = 0; absl_raw_log_internal_basename._4_4_ < 0x100;
        absl_raw_log_internal_basename._4_4_ = absl_raw_log_internal_basename._4_4_ + 1) {
      this->table_[_j][absl_raw_log_internal_basename._4_4_] =
           t_00[_j][absl_raw_log_internal_basename._4_4_];
    }
  }
  iVar1 = CRCImpl::FillZeroesTable(0x82f63b78,t_00);
  if (0x100 < iVar1) {
    raw_log_internal::RawLog
              (kFatal,"crc.cc",0xd0,"Check %s failed: %s",
               "j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_))","");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/crc/internal/crc.cc"
                  ,0xd0,"virtual void absl::crc_internal::CRC32::InitTables()");
  }
  for (absl_raw_log_internal_basename_1._4_4_ = 0; absl_raw_log_internal_basename_1._4_4_ < iVar1;
      absl_raw_log_internal_basename_1._4_4_ = absl_raw_log_internal_basename_1._4_4_ + 1) {
    this->zeroes_[absl_raw_log_internal_basename_1._4_4_] =
         (*t_00)[absl_raw_log_internal_basename_1._4_4_];
  }
  if (t_00 != (Uint32By256 *)0x0) {
    operator_delete__(t_00);
  }
  poly = anon_unknown_0::ReverseBits(0x5ec76f1);
  CRCImpl::FillWordTable(poly,poly,1,&this->reverse_table0_);
  iVar1 = CRCImpl::FillZeroesTable(poly,&this->reverse_zeroes_);
  if (iVar1 < 0x101) {
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"crc.cc",0xfd,"Check %s failed: %s",
             "j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_))","",t_00,this,"crc.cc");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/crc/internal/crc.cc"
                ,0xfd,"virtual void absl::crc_internal::CRC32::InitTables()");
}

Assistant:

void CRC32::InitTables() {
  // Compute the table for extending a CRC by one byte.
  Uint32By256* t = new Uint32By256[4];
  FillWordTable(kCrc32cPoly, kCrc32cPoly, 1, t);
  for (int i = 0; i != 256; i++) {
    this->table0_[i] = t[0][i];
  }

  // Construct a table for updating the CRC by 4 bytes data followed by
  // 12 bytes of zeroes.
  //
  // Note: the data word size could be larger than the CRC size; it might
  // be slightly faster to use a 64-bit data word, but doing so doubles the
  // table size.
  uint32_t last = kCrc32cPoly;
  const size_t size = 12;
  for (size_t i = 0; i < size; ++i) {
    last = (last >> 8) ^ this->table0_[last & 0xff];
  }
  FillWordTable(kCrc32cPoly, last, 4, t);
  for (size_t b = 0; b < 4; ++b) {
    for (int i = 0; i < 256; ++i) {
      this->table_[b][i] = t[b][i];
    }
  }

  int j = FillZeroesTable(kCrc32cPoly, t);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_)), "");
  for (int i = 0; i < j; i++) {
    this->zeroes_[i] = t[0][i];
  }

  delete[] t;

  // Build up tables for _reversing_ the operation of doing CRC operations on
  // zero bytes.

  // In C++, extending `crc` by a single zero bit is done by the following:
  // (A)  bool low_bit_set = (crc & 1);
  //      crc >>= 1;
  //      if (low_bit_set) crc ^= kCrc32cPoly;
  //
  // In particular note that the high bit of `crc` after this operation will be
  // set if and only if the low bit of `crc` was set before it.  This means that
  // no information is lost, and the operation can be reversed, as follows:
  // (B)  bool high_bit_set = (crc & 0x80000000u);
  //      if (high_bit_set) crc ^= kCrc32cPoly;
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= 1;
  //
  // Or, equivalently:
  // (C)  bool high_bit_set = (crc & 0x80000000u);
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= ((kCrc32cPoly << 1) ^ 1);
  //
  // The last observation is, if we store our checksums in variable `rcrc`,
  // with order of the bits reversed, the inverse operation becomes:
  // (D)  bool low_bit_set = (rcrc & 1);
  //      rcrc >>= 1;
  //      if (low_bit_set) rcrc ^= ReverseBits((kCrc32cPoly << 1) ^ 1)
  //
  // This is the same algorithm (A) that we started with, only with a different
  // polynomial bit pattern.  This means that by building up our tables with
  // this alternate polynomial, we can apply the CRC algorithms to a
  // bit-reversed CRC checksum to perform inverse zero-extension.

  const uint32_t kCrc32cUnextendPoly =
      ReverseBits(static_cast<uint32_t>((kCrc32cPoly << 1) ^ 1));
  FillWordTable(kCrc32cUnextendPoly, kCrc32cUnextendPoly, 1, &reverse_table0_);

  j = FillZeroesTable(kCrc32cUnextendPoly, &reverse_zeroes_);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_)),
                 "");
}